

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::DecimalQuantity::switchStorage(DecimalQuantity *this)

{
  long lVar1;
  int8_t *piVar2;
  uint64_t uVar3;
  
  if (this->usingBytes == true) {
    if ((long)this->precision < 1) {
      piVar2 = (int8_t *)0x0;
    }
    else {
      lVar1 = (long)this->precision + 1;
      piVar2 = (int8_t *)0x0;
      do {
        piVar2 = (int8_t *)((long)*(char *)(((this->fBCD).bcdLong - 2) + lVar1) | (long)piVar2 << 4)
        ;
        lVar1 = lVar1 + -1;
      } while (1 < lVar1);
    }
    uprv_free_63((this->fBCD).bcdBytes.ptr);
    (this->fBCD).bcdBytes.ptr = piVar2;
    this->usingBytes = false;
  }
  else {
    uVar3 = (this->fBCD).bcdLong;
    ensureCapacity(this,0x28);
    if (0 < this->precision) {
      lVar1 = 0;
      do {
        (this->fBCD).bcdBytes.ptr[lVar1] = (byte)uVar3 & 0xf;
        uVar3 = uVar3 >> 4;
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->precision);
    }
  }
  return;
}

Assistant:

void DecimalQuantity::switchStorage() {
    if (usingBytes) {
        // Change from bytes to long
        uint64_t bcdLong = 0L;
        for (int i = precision - 1; i >= 0; i--) {
            bcdLong <<= 4;
            bcdLong |= fBCD.bcdBytes.ptr[i];
        }
        uprv_free(fBCD.bcdBytes.ptr);
        fBCD.bcdBytes.ptr = nullptr;
        fBCD.bcdLong = bcdLong;
        usingBytes = false;
    } else {
        // Change from long to bytes
        // Copy the long into a local variable since it will get munged when we allocate the bytes
        uint64_t bcdLong = fBCD.bcdLong;
        ensureCapacity();
        for (int i = 0; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(bcdLong & 0xf);
            bcdLong >>= 4;
        }
        U_ASSERT(usingBytes);
    }
}